

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

void cJSON_AddItemReferenceToObject(cJSON *object,char *string,cJSON *item)

{
  byte *pbVar1;
  cJSON *pcVar2;
  cJSON *pcVar3;
  char *pcVar4;
  int iVar5;
  undefined4 uVar6;
  int iVar7;
  undefined4 uVar8;
  cJSON *item_00;
  
  item_00 = (cJSON *)(*global_hooks.allocate)(0x40);
  if (item_00 != (cJSON *)0x0) {
    item_00->valuedouble = 0.0;
    item_00->string = (char *)0x0;
    item_00->valuestring = (char *)0x0;
    *(undefined8 *)&item_00->valueint = 0;
    item_00->child = (cJSON *)0x0;
    *(undefined8 *)&item_00->type = 0;
    item_00->next = (cJSON *)0x0;
    item_00->prev = (cJSON *)0x0;
    pcVar2 = item->next;
    pcVar3 = item->prev;
    iVar5 = item->type;
    uVar6 = *(undefined4 *)&item->field_0x1c;
    pcVar4 = item->valuestring;
    iVar7 = item->valueint;
    uVar8 = *(undefined4 *)&item->field_0x2c;
    item_00->child = item->child;
    item_00->type = iVar5;
    *(undefined4 *)&item_00->field_0x1c = uVar6;
    item_00->next = pcVar2;
    item_00->prev = pcVar3;
    item_00->valuestring = pcVar4;
    item_00->valueint = iVar7;
    *(undefined4 *)&item_00->field_0x2c = uVar8;
    item_00->valuedouble = item->valuedouble;
    pbVar1 = (byte *)((long)&item_00->type + 1);
    *pbVar1 = *pbVar1 | 1;
    item_00->next = (cJSON *)0x0;
    item_00->prev = (cJSON *)0x0;
  }
  cJSON_AddItemToObject(object,string,item_00);
  return;
}

Assistant:

CJSON_PUBLIC(void) cJSON_AddItemReferenceToObject(cJSON *object, const char *string, cJSON *item)
{
    cJSON_AddItemToObject(object, string, create_reference(item, &global_hooks));
}